

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsEquality2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  iterator iVar1;
  TestError *pTVar2;
  allocator<char> local_51;
  string shader_source;
  
  iVar1 = std::
          _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
          ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                  *)supported_variable_types_map,(key_type *)Interface::ES::var_types);
  if (iVar1._M_node == (_Base_ptr)(supported_variable_types_map + 8)) {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Type not found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xe08);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shader_source,
             "struct light {\n    float intensity;\n    int position;\n};\n\n",&local_51);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  switch((ulong)tested_shader_type) {
  case 0:
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 2:
  case 5:
    break;
  case 4:
  case 3:
    std::__cxx11::string::append((string *)&shader_source);
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xdfc);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_0171bc58 + *(int *)(&DAT_0171bc58 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void ExpressionsEquality2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = API::n_var_types;

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = "struct light {\n    float intensity;\n    int position;\n};\n\n";

			shader_source += shader_start;
			shader_source += "    light[][] x =";
			shader_source += "light";
			shader_source += "[][](";
			shader_source += "light";
			shader_source += "[](light(1.0, 1)),";
			shader_source += "light";
			shader_source += "[](light(2.0, 2)));\n\n";
			shader_source += "    light[][] y =";
			shader_source += "light";
			shader_source += "[][](";
			shader_source += "light";
			shader_source += "[](light(3.0, 3)),";
			shader_source += "light";
			shader_source += "[](light(4.0, 4)));\n\n";
			shader_source += "    float result = 0.0;\n\n";
			shader_source += "    if (x == y)\n";
			shader_source += "    {\n";
			shader_source += "        result = 1.0;\n";
			shader_source += "    }\n";
			shader_source += "    if (y != x)\n";
			shader_source += "    {\n";
			shader_source += "        result = 2.0;\n";
			shader_source += "    }\n";

			/* Apply stage specific stuff */
			switch (tested_shader_type)
			{
			case TestCaseBase<API>::VERTEX_SHADER_TYPE:
				shader_source += "\n    gl_Position = vec4(0.0,0.0,0.0,1.0);\n";
				break;
			case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
				shader_source += "\n    gl_FragDepth = result;\n";
				break;
			case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
				break;
			case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
				shader_source += emit_quad;
				break;
			case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
				shader_source += set_tesseation;
				break;
			case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
				break;
			default:
				TCU_FAIL("Unrecognized shader type.");
				break;
			}

			/* End main function */
			shader_source += shader_end;

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}